

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.hpp
# Opt level: O1

void __thiscall
Shell::Options::OptionValue<bool>::OptionValue(OptionValue<bool> *this,string *l,string *s,bool def)

{
  byte in_CL;
  string *in_RDX;
  string *in_RSI;
  Stack<std::unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>_>
  *in_RDI;
  AbstractOptionValue *in_stack_ffffffffffffff90;
  Stack<std::unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>_>
  *this_00;
  string *in_stack_ffffffffffffffa0;
  string local_40 [48];
  
  this_00 = in_RDI;
  std::__cxx11::string::string(local_40,in_RSI);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffa0,in_RDX);
  AbstractOptionValue::AbstractOptionValue
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffffa0,(string *)this_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::__cxx11::string::~string(local_40);
  ((_Alloc_hider *)&in_RDI->_capacity)->_M_p = (pointer)&PTR__OptionValue_00b4c890;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)&in_RDI[4]._cursor)->_M_local_buf[1] = in_CL & 1;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)&in_RDI[4]._cursor)->_M_local_buf[2] = in_CL & 1;
  ::Lib::
  Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>_>
  ::Stack((Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>_>
           *)this_00,(size_t)in_stack_ffffffffffffff90);
  ::Lib::
  Stack<std::unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>_>
  ::Stack(this_00,(size_t)in_stack_ffffffffffffff90);
  return;
}

Assistant:

OptionValue(std::string l, std::string s,T def) : AbstractOptionValue(l,s),
        defaultValue(def), actualValue(def){}